

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O0

void png_set_sPLT(png_const_structrp png_ptr,png_inforp info_ptr,png_const_sPLT_tp entries,
                 int nentries)

{
  png_sPLT_tp ppVar1;
  size_t sVar2;
  png_voidp pvVar3;
  size_t length;
  png_sPLT_tp np;
  png_const_sPLT_tp ppStack_20;
  int nentries_local;
  png_const_sPLT_tp entries_local;
  png_inforp info_ptr_local;
  png_const_structrp png_ptr_local;
  
  if ((((png_ptr != (png_const_structrp)0x0) && (info_ptr != (png_inforp)0x0)) && (0 < nentries)) &&
     (entries != (png_const_sPLT_tp)0x0)) {
    ppVar1 = (png_sPLT_tp)
             png_realloc_array(png_ptr,info_ptr->splt_palettes,info_ptr->splt_palettes_num,nentries,
                               0x20);
    if (ppVar1 == (png_sPLT_tp)0x0) {
      png_chunk_report(png_ptr,"too many sPLT chunks",1);
    }
    else {
      png_free(png_ptr,info_ptr->splt_palettes);
      info_ptr->splt_palettes = ppVar1;
      info_ptr->free_me = info_ptr->free_me | 0x20;
      length = (size_t)(ppVar1 + info_ptr->splt_palettes_num);
      np._4_4_ = nentries;
      ppStack_20 = entries;
      do {
        if ((ppStack_20->name == (png_charp)0x0) || (ppStack_20->entries == (png_sPLT_entryp)0x0)) {
          png_app_error(png_ptr,"png_set_sPLT: invalid sPLT");
        }
        else {
          *(png_byte *)(length + 8) = ppStack_20->depth;
          sVar2 = strlen(ppStack_20->name);
          pvVar3 = png_malloc_base(png_ptr,sVar2 + 1);
          *(png_voidp *)length = pvVar3;
          if (*(long *)length == 0) break;
          memcpy(*(void **)length,ppStack_20->name,sVar2 + 1);
          pvVar3 = png_malloc_array(png_ptr,ppStack_20->nentries,10);
          *(png_voidp *)(length + 0x10) = pvVar3;
          if (*(long *)(length + 0x10) == 0) {
            png_free(png_ptr,*(png_voidp *)length);
            *(undefined8 *)length = 0;
            break;
          }
          *(png_int_32 *)(length + 0x18) = ppStack_20->nentries;
          memcpy(*(void **)(length + 0x10),ppStack_20->entries,
                 (ulong)(uint)ppStack_20->nentries * 10);
          info_ptr->valid = info_ptr->valid | 0x2000;
          info_ptr->splt_palettes_num = info_ptr->splt_palettes_num + 1;
          length = length + 0x20;
          ppStack_20 = ppStack_20 + 1;
        }
        np._4_4_ = np._4_4_ + -1;
      } while (np._4_4_ != 0);
      if (0 < np._4_4_) {
        png_chunk_report(png_ptr,"sPLT out of memory",1);
      }
    }
  }
  return;
}

Assistant:

void PNGAPI
png_set_sPLT(png_const_structrp png_ptr,
    png_inforp info_ptr, png_const_sPLT_tp entries, int nentries)
/*
 *  entries        - array of png_sPLT_t structures
 *                   to be added to the list of palettes
 *                   in the info structure.
 *
 *  nentries       - number of palette structures to be
 *                   added.
 */
{
   png_sPLT_tp np;

   png_debug1(1, "in %s storage function", "sPLT");

   if (png_ptr == NULL || info_ptr == NULL || nentries <= 0 || entries == NULL)
      return;

   /* Use the internal realloc function, which checks for all the possible
    * overflows.  Notice that the parameters are (int) and (size_t)
    */
   np = png_voidcast(png_sPLT_tp,png_realloc_array(png_ptr,
       info_ptr->splt_palettes, info_ptr->splt_palettes_num, nentries,
       sizeof *np));

   if (np == NULL)
   {
      /* Out of memory or too many chunks */
      png_chunk_report(png_ptr, "too many sPLT chunks", PNG_CHUNK_WRITE_ERROR);
      return;
   }

   png_free(png_ptr, info_ptr->splt_palettes);

   info_ptr->splt_palettes = np;
   info_ptr->free_me |= PNG_FREE_SPLT;

   np += info_ptr->splt_palettes_num;

   do
   {
      size_t length;

      /* Skip invalid input entries */
      if (entries->name == NULL || entries->entries == NULL)
      {
         /* png_handle_sPLT doesn't do this, so this is an app error */
         png_app_error(png_ptr, "png_set_sPLT: invalid sPLT");
         /* Just skip the invalid entry */
         continue;
      }

      np->depth = entries->depth;

      /* In the event of out-of-memory just return - there's no point keeping
       * on trying to add sPLT chunks.
       */
      length = strlen(entries->name) + 1;
      np->name = png_voidcast(png_charp, png_malloc_base(png_ptr, length));

      if (np->name == NULL)
         break;

      memcpy(np->name, entries->name, length);

      /* IMPORTANT: we have memory now that won't get freed if something else
       * goes wrong; this code must free it.  png_malloc_array produces no
       * warnings; use a png_chunk_report (below) if there is an error.
       */
      np->entries = png_voidcast(png_sPLT_entryp, png_malloc_array(png_ptr,
          entries->nentries, sizeof (png_sPLT_entry)));

      if (np->entries == NULL)
      {
         png_free(png_ptr, np->name);
         np->name = NULL;
         break;
      }

      np->nentries = entries->nentries;
      /* This multiply can't overflow because png_malloc_array has already
       * checked it when doing the allocation.
       */
      memcpy(np->entries, entries->entries,
          (unsigned int)entries->nentries * sizeof (png_sPLT_entry));

      /* Note that 'continue' skips the advance of the out pointer and out
       * count, so an invalid entry is not added.
       */
      info_ptr->valid |= PNG_INFO_sPLT;
      ++(info_ptr->splt_palettes_num);
      ++np;
      ++entries;
   }
   while (--nentries);

   if (nentries > 0)
      png_chunk_report(png_ptr, "sPLT out of memory", PNG_CHUNK_WRITE_ERROR);
}